

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O0

void __thiscall
LASquadtree::intersect_circle_with_cells
          (LASquadtree *this,F64 center_x,F64 center_y,F64 radius,F64 r_min_x,F64 r_min_y,
          F64 r_max_x,F64 r_max_y,F32 cell_min_x,F32 cell_max_x,F32 cell_min_y,F32 cell_max_y,
          U32 level,U32 level_index)

{
  BOOL BVar1;
  float local_60;
  float local_5c;
  float local_58;
  float cell_mid_y;
  float cell_mid_x;
  U32 level_index_local;
  U32 level_local;
  F32 cell_min_x_local;
  F64 r_max_y_local;
  F64 r_max_x_local;
  F64 r_min_y_local;
  F64 r_min_x_local;
  F64 radius_local;
  F64 center_y_local;
  F64 center_x_local;
  LASquadtree *this_local;
  
  level_index_local = (U32)cell_min_x;
  _level_local = r_max_y;
  r_max_y_local = r_max_x;
  r_max_x_local = r_min_y;
  r_min_y_local = r_min_x;
  r_min_x_local = radius;
  radius_local = center_y;
  center_y_local = center_x;
  center_x_local = (F64)this;
  if (level == 0) {
    cell_mid_y = (float)level_index;
    cell_mid_x = (float)level;
    BVar1 = intersect_circle_with_rectangle
                      (this,center_x,center_y,radius,cell_min_x,cell_max_x,cell_min_y,cell_max_y);
    if (BVar1) {
      local_60 = cell_mid_y;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)this->current_cells,
                 (value_type_conflict *)&local_60);
    }
  }
  else {
    cell_mid_x = (float)(level - 1);
    cell_mid_y = (float)(level_index << 2);
    local_58 = ((float)cell_min_x + (float)cell_max_x) / 2.0;
    local_5c = ((float)cell_min_y + (float)cell_max_y) / 2.0;
    if ((double)local_58 < (double)r_max_x) {
      if ((double)r_min_x < (double)local_58) {
        if ((double)local_5c < (double)r_max_y) {
          if ((double)r_min_y < (double)local_5c) {
            intersect_circle_with_cells
                      (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                       (F32)local_58,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(U32)cell_mid_y);
            intersect_circle_with_cells
                      (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                       r_max_y_local,_level_local,(F32)local_58,cell_max_x,cell_min_y,(F32)local_5c,
                       (U32)cell_mid_x,(uint)cell_mid_y | 1);
            intersect_circle_with_cells
                      (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                       r_max_y_local,_level_local,(F32)level_index_local,(F32)local_58,(F32)local_5c
                       ,cell_max_y,(U32)cell_mid_x,(uint)cell_mid_y | 2);
            intersect_circle_with_cells
                      (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                       r_max_y_local,_level_local,(F32)local_58,cell_max_x,(F32)local_5c,cell_max_y,
                       (U32)cell_mid_x,(uint)cell_mid_y | 3);
          }
          else {
            intersect_circle_with_cells
                      (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                       (F32)local_58,(F32)local_5c,cell_max_y,(U32)cell_mid_x,(uint)cell_mid_y | 2);
            intersect_circle_with_cells
                      (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                       r_max_y_local,_level_local,(F32)local_58,cell_max_x,(F32)local_5c,cell_max_y,
                       (U32)cell_mid_x,(uint)cell_mid_y | 3);
          }
        }
        else {
          intersect_circle_with_cells
                    (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                     (F32)local_58,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(U32)cell_mid_y);
          intersect_circle_with_cells
                    (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                     r_max_y_local,_level_local,(F32)local_58,cell_max_x,cell_min_y,(F32)local_5c,
                     (U32)cell_mid_x,(uint)cell_mid_y | 1);
        }
      }
      else if ((double)local_5c < (double)r_max_y) {
        if ((double)r_min_y < (double)local_5c) {
          intersect_circle_with_cells
                    (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,(F32)local_58,
                     cell_max_x,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(uint)cell_mid_y | 1);
          intersect_circle_with_cells
                    (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                     r_max_y_local,_level_local,(F32)local_58,cell_max_x,(F32)local_5c,cell_max_y,
                     (U32)cell_mid_x,(uint)cell_mid_y | 3);
        }
        else {
          intersect_circle_with_cells
                    (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,(F32)local_58,
                     cell_max_x,(F32)local_5c,cell_max_y,(U32)cell_mid_x,(uint)cell_mid_y | 3);
        }
      }
      else {
        intersect_circle_with_cells
                  (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,(F32)local_58,
                   cell_max_x,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(uint)cell_mid_y | 1);
      }
    }
    else if ((double)local_5c < (double)r_max_y) {
      if ((double)r_min_y < (double)local_5c) {
        intersect_circle_with_cells
                  (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                   (F32)local_58,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(U32)cell_mid_y);
        intersect_circle_with_cells
                  (this,center_y_local,radius_local,r_min_x_local,r_min_y_local,r_max_x_local,
                   r_max_y_local,_level_local,(F32)level_index_local,(F32)local_58,(F32)local_5c,
                   cell_max_y,(U32)cell_mid_x,(uint)cell_mid_y | 2);
      }
      else {
        intersect_circle_with_cells
                  (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                   (F32)local_58,(F32)local_5c,cell_max_y,(U32)cell_mid_x,(uint)cell_mid_y | 2);
      }
    }
    else {
      intersect_circle_with_cells
                (this,center_x,center_y,radius,r_min_x,r_min_y,r_max_x,r_max_y,cell_min_x,
                 (F32)local_58,cell_min_y,(F32)local_5c,(U32)cell_mid_x,(U32)cell_mid_y);
    }
  }
  return;
}

Assistant:

void LASquadtree::intersect_circle_with_cells(const F64 center_x, const F64 center_y, const F64 radius, const F64 r_min_x, const F64 r_min_y, const F64 r_max_x, const F64 r_max_y, const F32 cell_min_x, const F32 cell_max_x, const F32 cell_min_y, const F32 cell_max_y, U32 level, U32 level_index)
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  if (level)
  {
    level--;
    level_index <<= 2;

    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;

    if (r_max_x <= cell_mid_x)
    {
      // cell_max_x = cell_mid_x;
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
      }
    }
    else if (!(r_min_x < cell_mid_x))
    {
      // cell_min_x = cell_mid_x;
      // level_index |= 1;
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
    else
    {
      if (r_max_y <= cell_mid_y)
      {
        // cell_max_y = cell_mid_y;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
      }
      else if (!(r_min_y < cell_mid_y))
      {
        // cell_min_y = cell_mid_y;
        // level_index |= 1;
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
      else
      {
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_min_y, cell_mid_y, level, level_index);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_min_y, cell_mid_y, level, level_index | 1);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_min_x, cell_mid_x, cell_mid_y, cell_max_y, level, level_index | 2);
        intersect_circle_with_cells(center_x, center_y, radius, r_min_x, r_min_y, r_max_x, r_max_y, cell_mid_x, cell_max_x, cell_mid_y, cell_max_y, level, level_index | 3);
      }
    }
  }
  else
  {
    if (intersect_circle_with_rectangle(center_x, center_y, radius, cell_min_x, cell_max_x, cell_min_y, cell_max_y))
    {
      ((my_cell_vector*)current_cells)->push_back(level_index);
    }
  }
}